

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int JS_AddModuleExport(JSContext *ctx,JSModuleDef *m,char *export_name)

{
  JSAtom export_name_00;
  size_t len;
  JSExportEntry *pJVar1;
  int iVar2;
  
  len = strlen(export_name);
  export_name_00 = JS_NewAtomLen(ctx,export_name,len);
  if (export_name_00 == 0) {
    iVar2 = -1;
  }
  else {
    pJVar1 = add_export_entry2(ctx,(JSParseState *)0x0,m,0,export_name_00,JS_EXPORT_TYPE_LOCAL);
    JS_FreeAtom(ctx,export_name_00);
    iVar2 = -(uint)(pJVar1 == (JSExportEntry *)0x0);
  }
  return iVar2;
}

Assistant:

int JS_AddModuleExport(JSContext *ctx, JSModuleDef *m, const char *export_name)
{
    JSExportEntry *me;
    JSAtom name;
    name = JS_NewAtom(ctx, export_name);
    if (name == JS_ATOM_NULL)
        return -1;
    me = add_export_entry2(ctx, NULL, m, JS_ATOM_NULL, name,
                           JS_EXPORT_TYPE_LOCAL);
    JS_FreeAtom(ctx, name);
    if (!me)
        return -1;
    else
        return 0;
}